

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

size_t __thiscall
DSectorPlaneInterpolation::PointerSubstitution
          (DSectorPlaneInterpolation *this,DObject *old,DObject *notOld)

{
  uint uVar1;
  DInterpolation **ppDVar2;
  uint local_28;
  int local_24;
  uint i;
  int subst;
  DObject *notOld_local;
  DObject *old_local;
  DSectorPlaneInterpolation *this_local;
  
  local_24 = 0;
  local_28 = 0;
  while( true ) {
    uVar1 = TArray<DInterpolation_*,_DInterpolation_*>::Size(&this->attached);
    if (uVar1 <= local_28) break;
    ppDVar2 = TArray<DInterpolation_*,_DInterpolation_*>::operator[]
                        (&this->attached,(ulong)local_28);
    if (*ppDVar2 == (DInterpolation *)old) {
      ppDVar2 = TArray<DInterpolation_*,_DInterpolation_*>::operator[]
                          (&this->attached,(ulong)local_28);
      *ppDVar2 = (DInterpolation *)notOld;
      local_24 = local_24 + 1;
    }
    local_28 = local_28 + 1;
  }
  return (long)local_24;
}

Assistant:

size_t DSectorPlaneInterpolation::PointerSubstitution (DObject *old, DObject *notOld)
{
	int subst = 0;
	for(unsigned i=0; i<attached.Size(); i++)
	{
		if (attached[i] == old) 
		{
			attached[i] = (DInterpolation*)notOld;
			subst++;
		}
	}
	return subst;
}